

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O3

void refreshDisplay(void)

{
  undefined8 uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  int y;
  int iVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 auVar8 [16];
  
  if (refreshDisplay::surface_handle == -1) {
    refreshDisplay::surface_handle = open("/dev/fb0",2);
    refreshDisplay::surface_buffer =
         (uint8_t *)mmap((void *)0x0,0x2000,3,1,refreshDisplay::surface_handle,0);
  }
  puVar3 = jedi_screen_buffer;
  iVar4 = 0;
  pbVar2 = refreshDisplay::surface_buffer;
  do {
    lVar5 = 0;
    do {
      uVar1 = *(undefined8 *)(puVar3 + lVar5);
      bVar7 = (byte)uVar1;
      bVar9 = (byte)((ulong)uVar1 >> 8);
      bVar10 = (byte)((ulong)uVar1 >> 0x10);
      bVar11 = (byte)((ulong)uVar1 >> 0x18);
      bVar12 = (byte)((ulong)uVar1 >> 0x20);
      bVar13 = (byte)((ulong)uVar1 >> 0x28);
      bVar14 = (byte)((ulong)uVar1 >> 0x30);
      bVar6 = (byte)((ulong)uVar1 >> 0x38);
      auVar8[0] = -((byte)((0x80 < bVar7) * -0x80 | (0x80 >= bVar7) * bVar7) == bVar7);
      auVar8[1] = -((byte)((0x80 < bVar9) * -0x80 | (0x80 >= bVar9) * bVar9) == bVar9);
      auVar8[2] = -((byte)((0x80 < bVar10) * -0x80 | (0x80 >= bVar10) * bVar10) == bVar10);
      auVar8[3] = -((byte)((0x80 < bVar11) * -0x80 | (0x80 >= bVar11) * bVar11) == bVar11);
      auVar8[4] = -((byte)((0x80 < bVar12) * -0x80 | (0x80 >= bVar12) * bVar12) == bVar12);
      auVar8[5] = -((byte)((0x80 < bVar13) * -0x80 | (0x80 >= bVar13) * bVar13) == bVar13);
      auVar8[6] = -((byte)((0x80 < bVar14) * -0x80 | (0x80 >= bVar14) * bVar14) == bVar14);
      auVar8[7] = -((byte)((0x80 < bVar6) * -0x80 | (0x80 >= bVar6) * bVar6) == bVar6);
      auVar8[8] = 0xff;
      auVar8[9] = 0xff;
      auVar8[10] = 0xff;
      auVar8[0xb] = 0xff;
      auVar8[0xc] = 0xff;
      auVar8[0xd] = 0xff;
      auVar8[0xe] = 0xff;
      auVar8[0xf] = 0xff;
      bVar7 = ~(SUB161(auVar8 >> 7,0) & 1 | (SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar8 >> 0x17,0) & 1) << 2 | (SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar8 >> 0x27,0) & 1) << 4 | (SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar8 >> 0x37,0) & 1) << 6 | SUB161(auVar8 >> 0x3f,0) << 7);
      bVar6 = bVar7 & 1 | 2;
      if ((bVar7 & 2) == 0) {
        bVar6 = bVar7 & 1;
      }
      bVar9 = bVar6 + 4;
      if ((bVar7 & 4) == 0) {
        bVar9 = bVar6;
      }
      bVar6 = bVar9 | 8;
      if ((bVar7 & 8) == 0) {
        bVar6 = bVar9;
      }
      bVar9 = bVar6 | 0x10;
      if ((bVar7 & 0x10) == 0) {
        bVar9 = bVar6;
      }
      bVar6 = bVar9 | 0x20;
      if ((bVar7 & 0x20) == 0) {
        bVar6 = bVar9;
      }
      bVar9 = bVar6 | 0x40;
      if ((bVar7 & 0x40) == 0) {
        bVar9 = bVar6;
      }
      bVar6 = bVar9 | 0x80;
      if ((bVar7 & 0x80) == 0) {
        bVar6 = bVar9;
      }
      *pbVar2 = bVar6;
      pbVar2 = pbVar2 + 1;
      lVar5 = lVar5 + 8;
    } while ((int)lVar5 != 0x80);
    iVar4 = iVar4 + 1;
    puVar3 = puVar3 + lVar5;
  } while (iVar4 != 0x40);
  return;
}

Assistant:

static void refreshDisplay()
{
#ifdef USE_SDL
    SDL_Surface* screen = SDL_GetVideoSurface();
#ifdef DEBUG
    for(int x=0; x<NUMCOLS; x++)
    {
        for(int y=0; y<NUMLINES; y++)
        {
            int c = char_at_place(x, y);
            
            for(int _x=0; _x<4; _x++)
            {
                for(int _y=0; _y<6; _y++)
                {
                    int color = (font_data[c * 6 + _y] & (0x08>>_x)) ? 0x8080AF : 0x202020;
                    if (!(flags_at(x, y) & F_SEEN))
                        color /= 2;
                    SDL_Rect rect = {Sint16(128 * 5 + x * 4 * 2 + _x * 2), Sint16(y * 6 * 2 + _y * 2), 2, 2};
                    SDL_FillRect(screen, &rect, color);
                }
            }
        }
    }
#endif
    for(int x=0; x<DISPLAY_WIDTH; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT; y++)
        {
            int color = jedi_screen_buffer[x + y * DISPLAY_WIDTH] > 128 ? 0x8080AF : 0x202020;
            SDL_Rect rect = {Sint16(x * 5), Sint16(y * 5), 4, 4};
            SDL_FillRect(screen, &rect, color);
        }
    }
    SDL_Flip(screen);
#else
    static int surface_handle = -1;
    static uint8_t* surface_buffer;
    if (surface_handle == -1)
    {
        surface_handle = open("/dev/fb0", O_RDWR);
        surface_buffer = (uint8_t*)mmap(nullptr, DISPLAY_WIDTH * DISPLAY_HEIGHT, PROT_READ | PROT_WRITE, MAP_SHARED, surface_handle, 0);
    }

    uint8_t* src = jedi_screen_buffer;
    uint8_t* dst = surface_buffer;
    for(int y=0; y<DISPLAY_HEIGHT; y++)
    {
        for(int x=0; x<DISPLAY_WIDTH/8; x++)
        {
            uint8_t b = 0;
            if (*src++ > 128) b |= 0x01;
            if (*src++ > 128) b |= 0x02;
            if (*src++ > 128) b |= 0x04;
            if (*src++ > 128) b |= 0x08;
            if (*src++ > 128) b |= 0x10;
            if (*src++ > 128) b |= 0x20;
            if (*src++ > 128) b |= 0x40;
            if (*src++ > 128) b |= 0x80;
            *dst++ = b;
        }
    }
#endif
}